

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmXcFrameworkPlist> * __thiscall
cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::BindPrivate
          (Object<cmXcFrameworkPlist> *this,string_view *name,MemberFunction *func,bool required)

{
  Member local_58;
  
  local_58.Function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.Function._M_invoker = (_Invoker_type)0x0;
  local_58.Function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_58.Function.super__Function_base._M_functor._8_8_ = 0;
  local_58.Name._M_len = name->_M_len;
  local_58.Name._M_str = name->_M_str;
  std::function<bool_(cmXcFrameworkPlist_&,_const_Json::Value_*,_cmJSONState_*)>::operator=
            (&local_58.Function,func);
  local_58.Required = required;
  std::
  vector<cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::Member>_>
  ::emplace_back<cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::Member>(&this->Members,&local_58);
  if (required) {
    this->AnyRequired = true;
  }
  std::_Function_base::~_Function_base(&local_58.Function.super__Function_base);
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }